

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O3

int32_t __thiscall
duckdb::StrpTimeFormat::TryParseCollection
          (StrpTimeFormat *this,char *data,idx_t *pos,idx_t size,string_t *collection,
          idx_t collection_count)

{
  idx_t iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  
  if (collection_count != 0) {
    iVar1 = *pos;
    iVar5 = 0;
    do {
      uVar7 = (ulong)collection[iVar5].value.pointer.length;
      if (uVar7 < 0xd) {
        pcVar8 = collection[iVar5].value.pointer.prefix;
      }
      else {
        pcVar8 = collection[iVar5].value.pointer.ptr;
      }
      uVar4 = iVar1 + uVar7;
      if (uVar4 <= size) {
        uVar6 = 0;
        if (uVar7 != 0) {
          while( true ) {
            iVar2 = tolower((int)pcVar8[uVar6]);
            iVar3 = tolower((int)data[uVar6 + iVar1]);
            if (iVar2 != iVar3) break;
            uVar6 = uVar6 + 1;
            if (uVar7 == uVar6) goto LAB_014f3294;
          }
        }
        if (uVar6 == uVar7) {
LAB_014f3294:
          *pos = uVar4;
          return (int32_t)iVar5;
        }
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != collection_count);
  }
  return -1;
}

Assistant:

int32_t StrpTimeFormat::TryParseCollection(const char *data, idx_t &pos, idx_t size, const string_t collection[],
                                           idx_t collection_count) const {
	for (idx_t c = 0; c < collection_count; c++) {
		auto &entry = collection[c];
		auto entry_data = entry.GetData();
		auto entry_size = entry.GetSize();
		// check if this entry matches
		if (pos + entry_size > size) {
			// too big: can't match
			continue;
		}
		// compare the characters
		idx_t i;
		for (i = 0; i < entry_size; i++) {
			if (std::tolower(entry_data[i]) != std::tolower(data[pos + i])) {
				break;
			}
		}
		if (i == entry_size) {
			// full match
			pos += entry_size;
			return UnsafeNumericCast<int32_t>(c);
		}
	}
	return -1;
}